

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
mjs::source_file::source_file
          (source_file *this,wstring_view *filename,wstring_view *text,version ver)

{
  size_t sVar1;
  wchar_t *pwVar2;
  pointer pwVar3;
  wstring_view *s;
  wstring *__return_storage_ptr__;
  wstring local_50;
  
  this->ver_ = ver;
  sVar1 = filename->_M_len;
  pwVar2 = filename->_M_str;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&this->filename_,pwVar2,pwVar2 + sVar1);
  if (ver == es3) {
    __return_storage_ptr__ = &local_50;
    strip_format_control_characters_abi_cxx11_(__return_storage_ptr__,(mjs *)text,s);
  }
  else {
    local_50._M_string_length = text->_M_len;
    __return_storage_ptr__ = (wstring *)&text->_M_str;
  }
  pwVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  (this->text_)._M_dataplus._M_p = (pointer)&(this->text_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&this->text_,pwVar3,pwVar3 + local_50._M_string_length);
  if ((ver == es3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

explicit source_file(const std::wstring_view& filename, const std::wstring_view& text, version ver)
        : ver_(ver)
        , filename_(filename)
        , text_(ver == version::es3 ? strip_format_control_characters(text) : text) {
    }